

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O1

bool httplib::detail::parse_range_header(string *s,Ranges *ranges)

{
  size_type sVar1;
  pointer pcVar2;
  int iVar3;
  bool all_valid_ranges;
  anon_class_1_0_00000001 is_valid;
  byte local_5a;
  undefined1 local_59;
  long *local_58;
  undefined8 uStack_50;
  code *local_48;
  undefined8 uStack_40;
  _Any_data local_38;
  code *local_28;
  code *local_20;
  
  if ((7 < s->_M_string_length) &&
     (iVar3 = ::std::__cxx11::string::compare((ulong)s,0,(char *)0x6), iVar3 == 0)) {
    sVar1 = s->_M_string_length;
    local_5a = 1;
    pcVar2 = (s->_M_dataplus)._M_p;
    local_48 = (code *)0x0;
    uStack_40 = 0;
    local_58 = (long *)0x0;
    uStack_50 = 0;
    local_58 = (long *)operator_new(0x18);
    *local_58 = (long)&local_5a;
    local_58[1] = (long)&local_59;
    local_58[2] = (long)ranges;
    local_20 = std::
               _Function_handler<void_(const_char_*,_const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/examples/server/httplib.h:4927:40)>
               ::_M_invoke;
    local_38._8_8_ = uStack_50;
    local_28 = std::
               _Function_handler<void_(const_char_*,_const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/examples/server/httplib.h:4927:40)>
               ::_M_manager;
    local_48 = (code *)0x0;
    uStack_40 = 0;
    local_38._M_unused._M_object = local_58;
    split(pcVar2 + 6,pcVar2 + sVar1,',',0xffffffffffffffff,
          (function<void_(const_char_*,_const_char_*)> *)&local_38);
    if (local_28 != (code *)0x0) {
      (*local_28)(&local_38,&local_38,__destroy_functor);
    }
    if (local_48 != (code *)0x0) {
      (*local_48)(&local_58,&local_58,3);
    }
    return (bool)((ranges->
                  super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>
                  )._M_impl.super__Vector_impl_data._M_start !=
                  (ranges->
                  super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>
                  )._M_impl.super__Vector_impl_data._M_finish & local_5a);
  }
  return false;
}

Assistant:

inline bool parse_range_header(const std::string &s, Ranges &ranges) try {
#endif
  auto is_valid = [](const std::string &str) {
    return std::all_of(str.cbegin(), str.cend(),
                       [](unsigned char c) { return std::isdigit(c); });
  };

  if (s.size() > 7 && s.compare(0, 6, "bytes=") == 0) {
    const auto pos = static_cast<size_t>(6);
    const auto len = static_cast<size_t>(s.size() - 6);
    auto all_valid_ranges = true;
    split(&s[pos], &s[pos + len], ',', [&](const char *b, const char *e) {
      if (!all_valid_ranges) { return; }

      const auto it = std::find(b, e, '-');
      if (it == e) {
        all_valid_ranges = false;
        return;
      }

      const auto lhs = std::string(b, it);
      const auto rhs = std::string(it + 1, e);
      if (!is_valid(lhs) || !is_valid(rhs)) {
        all_valid_ranges = false;
        return;
      }

      const auto first =
          static_cast<ssize_t>(lhs.empty() ? -1 : std::stoll(lhs));
      const auto last =
          static_cast<ssize_t>(rhs.empty() ? -1 : std::stoll(rhs));
      if ((first == -1 && last == -1) ||
          (first != -1 && last != -1 && first > last)) {
        all_valid_ranges = false;
        return;
      }

      ranges.emplace_back(first, last);
    });
    return all_valid_ranges && !ranges.empty();
  }
  return false;
#ifdef CPPHTTPLIB_NO_EXCEPTIONS
}
#else
} catch (...) { return false; }